

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O0

shared_ptr<const_char> __thiscall
pstore::database::getro<char,void>(database *this,typed_address<char> addr,size_t elements)

{
  address size;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_char> sVar1;
  address local_30;
  size_t elements_local;
  database *this_local;
  typed_address<char> addr_local;
  
  elements_local = (size_t)addr.a_.a_;
  this_local = (database *)elements;
  addr_local.a_.a_ = (address)(address)this;
  local_30 = typed_address<char>::to_address((typed_address<char> *)&this_local);
  address::absolute(&stack0xffffffffffffffd0);
  size = typed_address<char>::to_address((typed_address<char> *)&this_local);
  getro((database *)&stack0xffffffffffffffc0,addr.a_.a_,size.a_);
  std::static_pointer_cast<char_const,void_const>((shared_ptr<const_void> *)this);
  std::shared_ptr<const_void>::~shared_ptr((shared_ptr<const_void> *)&stack0xffffffffffffffc0);
  sVar1.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<const_char>)sVar1.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T const> getro (typed_address<T> const addr,
                                        std::size_t const elements) const {
            if (addr.to_address ().absolute () % alignof (T) != 0) {
                raise (error_code::bad_alignment);
            }
            return std::static_pointer_cast<T const> (
                this->getro (addr.to_address (), sizeof (T) * elements));
        }